

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_varnode.cc
# Opt level: O0

void __thiscall Funcdata::setHighLevel(Funcdata *this)

{
  bool bVar1;
  uint4 uVar2;
  reference ppVVar3;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<Varnode_*> local_18;
  const_iterator iter;
  Funcdata *this_local;
  
  if ((this->flags & 1) == 0) {
    this->flags = this->flags | 1;
    iter._M_node = (_Base_ptr)this;
    uVar2 = VarnodeBank::getCreateIndex(&this->vbank);
    this->high_level_index = uVar2;
    std::_Rb_tree_const_iterator<Varnode_*>::_Rb_tree_const_iterator(&local_18);
    local_20 = (_Base_ptr)VarnodeBank::beginLoc(&this->vbank);
    local_18._M_node = local_20;
    while( true ) {
      local_28._M_node = (_Base_ptr)VarnodeBank::endLoc(&this->vbank);
      bVar1 = std::operator!=(&local_18,&local_28);
      if (!bVar1) break;
      ppVVar3 = std::_Rb_tree_const_iterator<Varnode_*>::operator*(&local_18);
      assignHigh(this,*ppVVar3);
      std::_Rb_tree_const_iterator<Varnode_*>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void Funcdata::setHighLevel(void)

{
  if ((flags & highlevel_on)!=0) return;
  flags |= highlevel_on;
  high_level_index = vbank.getCreateIndex();
  VarnodeLocSet::const_iterator iter;

  for(iter=vbank.beginLoc();iter!=vbank.endLoc();++iter)
    assignHigh(*iter);
}